

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseFile(Parser *this,TextFile *file,bool virtualFile)

{
  int iVar1;
  uint in_ECX;
  undefined7 in_register_00000011;
  EVP_PKEY_CTX *ctx;
  FileTokenizer tokenizer;
  FileTokenizer local_160;
  
  ctx = (EVP_PKEY_CTX *)CONCAT71(in_register_00000011,virtualFile);
  FileTokenizer::FileTokenizer(&local_160);
  iVar1 = FileTokenizer::init(&local_160,ctx);
  if ((char)iVar1 == '\0') {
    (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    parse(this,(Tokenizer *)file,SUB81(&local_160,0),(path *)((ulong)in_ECX & 0xff));
    if (ctx[0x269] == (EVP_PKEY_CTX)0x0) {
      Global.FileInfo.TotalLineCount = Global.FileInfo.TotalLineCount + *(int *)(ctx + 0x298);
    }
  }
  FileTokenizer::~FileTokenizer(&local_160);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseFile(TextFile& file, bool virtualFile)
{
	FileTokenizer tokenizer;
	if (!tokenizer.init(&file))
		return nullptr;

	std::unique_ptr<CAssemblerCommand> result = parse(&tokenizer,virtualFile,file.getFileName());

	if (!file.isFromMemory())
		Global.FileInfo.TotalLineCount += file.getNumLines();

	return result;
}